

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O0

void __thiscall
http_server::inbound_connection::inbound_connection(inbound_connection *this,http_server *parent)

{
  timer *t;
  anon_class_8_1_8991fb9c local_c8;
  callback_t local_c0;
  duration local_a0;
  function<void_()> local_88;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  anon_class_8_1_8991fb9c local_40;
  function<void_()> local_38;
  http_server *local_18;
  http_server *parent_local;
  inbound_connection *this_local;
  
  this->parent = parent;
  local_40.this = this;
  local_18 = parent;
  parent_local = (http_server *)this;
  std::function<void()>::
  function<http_server::inbound_connection::inbound_connection(http_server*)::__0,void>
            ((function<void()> *)&local_38,&local_40);
  local_68.this = this;
  std::function<void()>::
  function<http_server::inbound_connection::inbound_connection(http_server*)::__1,void>
            ((function<void()> *)&local_60,&local_68);
  std::function<void_()>::function(&local_88);
  server_socket::accept
            ((server_socket *)&this->socket,(int)parent + 8,(sockaddr *)&local_38,
             (socklen_t *)&local_60);
  std::function<void_()>::~function(&local_88);
  std::function<void_()>::~function(&local_60);
  std::function<void_()>::~function(&local_38);
  t = sysapi::epoll::get_timer(local_18->ep);
  local_a0.__r = 15000000000;
  local_c8.this = this;
  std::function<void()>::
  function<http_server::inbound_connection::inbound_connection(http_server*)::__2,void>
            ((function<void()> *)&local_c0,&local_c8);
  timer_element::timer_element(&this->timer,t,local_a0,&local_c0);
  std::function<void_()>::~function(&local_c0);
  this->request_received = 0;
  this->response_size = 0;
  this->response_sent = 0;
  std::unique_ptr<client_socket,std::default_delete<client_socket>>::
  unique_ptr<std::default_delete<client_socket>,void>
            ((unique_ptr<client_socket,std::default_delete<client_socket>> *)&this->target);
  return;
}

Assistant:

http_server::inbound_connection::inbound_connection(http_server* parent)
    : parent(parent)
    , socket(parent->ss.accept([this] {
        this->parent->connections.erase(this);
    }, [this] {
        try_read();
    }, client_socket::on_ready_t{}))
    , timer(parent->ep.get_timer(), timeout, [this] {
        this->parent->connections.erase(this);
    })
    , request_received(0)
    , response_size(0)
    , response_sent(0)
{}